

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_flip(roaring_bitmap_t *x1,uint64_t range_start,uint64_t range_end)

{
  _Bool _Var1;
  uint8_t uVar2;
  uint16_t hb;
  uint uVar3;
  uint uVar4;
  int iVar5;
  roaring_array_t *ra;
  run_container_t *c;
  roaring_bitmap_t *prVar6;
  array_container_t *src;
  uint16_t uVar7;
  uint64_t uVar8;
  ulong uVar9;
  ushort stopping_key;
  uint uVar10;
  run_container_t *local_50;
  uint local_44;
  roaring_array_t *local_40;
  ulong local_38;
  
  if (range_end <= range_start) {
    prVar6 = roaring_bitmap_copy(x1);
    return prVar6;
  }
  uVar8 = 0;
  if (range_end < 0x100000000) {
    uVar8 = range_end;
  }
  ra = &roaring_bitmap_create()->high_low_container;
  ra->flags = ra->flags & 0xfe | (x1->high_low_container).flags & 1;
  uVar9 = uVar8 - 1;
  stopping_key = (ushort)(range_start >> 0x10);
  ra_append_copies_until
            (ra,&x1->high_low_container,stopping_key,(_Bool)((x1->high_low_container).flags & 1));
  hb = (uint16_t)(uVar9 >> 0x10);
  uVar7 = (uint16_t)range_start;
  if (hb == stopping_key) {
    insert_flipped_container(ra,&x1->high_low_container,stopping_key,uVar7,(uint16_t)uVar9);
  }
  else {
    if (uVar7 != 0) {
      insert_flipped_container(ra,&x1->high_low_container,stopping_key,uVar7,0xffff);
      stopping_key = stopping_key + 1;
    }
    local_38 = uVar9 & 0xffff;
    local_44 = ((uint)(uVar9 >> 0x10) & 0xffff) - (uint)(local_38 != 0xffff) & 0xffff;
    local_40 = ra;
    for (uVar10 = (uint)stopping_key; ra = local_40, uVar10 <= local_44; uVar10 = uVar10 + 1) {
      uVar7 = (uint16_t)uVar10;
      uVar3 = ra_get_index(&x1->high_low_container,uVar7);
      uVar4 = ra_get_index(ra,uVar7);
      if ((int)uVar3 < 0) {
        c = run_container_create_range(0,0x10000);
        uVar2 = '\x03';
LAB_00106d5b:
        ra_insert_new_key_value_at(ra,~uVar4,uVar7,c,uVar2);
      }
      else {
        uVar2 = (x1->high_low_container).typecodes[uVar3 & 0xffff];
        src = (array_container_t *)(x1->high_low_container).containers[uVar3 & 0xffff];
        if (uVar2 == '\x04') {
          uVar2 = *(uint8_t *)&src->array;
          src = *(array_container_t **)src;
        }
        local_50 = (run_container_t *)0x0;
        if (uVar2 == '\x03') {
          iVar5 = run_container_negation((run_container_t *)src,&local_50);
          uVar2 = (uint8_t)iVar5;
        }
        else if (uVar2 == '\x02') {
          local_50 = (run_container_t *)bitset_container_create();
          array_container_negation(src,(bitset_container_t *)local_50);
          uVar2 = '\x01';
        }
        else {
          _Var1 = bitset_container_negation((bitset_container_t *)src,&local_50);
          uVar2 = '\x02' - _Var1;
        }
        c = local_50;
        iVar5 = container_get_cardinality(local_50,uVar2);
        ra = local_40;
        if (iVar5 != 0) goto LAB_00106d5b;
        container_free(c,uVar2);
      }
    }
    if ((int)local_38 != 0xffff) {
      insert_flipped_container(local_40,&x1->high_low_container,hb,0,(uint16_t)uVar9);
    }
  }
  ra_append_copies_after(ra,&x1->high_low_container,hb,(_Bool)((x1->high_low_container).flags & 1));
  return (roaring_bitmap_t *)ra;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_flip(const roaring_bitmap_t *x1,
                                      uint64_t range_start,
                                      uint64_t range_end) {
    if (range_start >= range_end) {
        return roaring_bitmap_copy(x1);
    }
    if (range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }

    roaring_bitmap_t *ans = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(ans, is_cow(x1));

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;  // & 0xFFFF;
    uint16_t hb_end = (uint16_t)((range_end - 1) >> 16);
    const uint16_t lb_end = (uint16_t)(range_end - 1);  // & 0xFFFF;

    ra_append_copies_until(&ans->high_low_container, &x1->high_low_container,
                           hb_start, is_cow(x1));
    if (hb_start == hb_end) {
        insert_flipped_container(&ans->high_low_container,
                                 &x1->high_low_container, hb_start, lb_start,
                                 lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_start,
                                     lb_start, 0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;  // later we'll handle the partial block

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            insert_fully_flipped_container(&ans->high_low_container,
                                           &x1->high_low_container,
                                           (uint16_t)hb);
        }

        // handle a partial final container
        if (lb_end != 0xFFFF) {
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_end + 1, 0,
                                     lb_end);
            ++hb_end;
        }
    }
    ra_append_copies_after(&ans->high_low_container, &x1->high_low_container,
                           hb_end, is_cow(x1));
    return ans;
}